

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int I2CGetBit(wfRx_t *w)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t *puVar5;
  
  uVar1 = (w->field_4).I.SDA;
  gpioReg[(ulong)uVar1 / 10] =
       gpioReg[(ulong)uVar1 / 10] &
       ~(7 << (((char)uVar1 + (char)(uVar1 / 10) * -10) * '\x03' & 0x1fU));
  myGpioDelay((w->field_4).s.bufSize);
  I2C_clock_stretch(w);
  puVar5 = gpioReg;
  uVar1 = (w->field_4).I.SDA;
  gpioReg[(ulong)uVar1 / 10] =
       gpioReg[(ulong)uVar1 / 10] &
       ~(7 << (((char)uVar1 + (char)(uVar1 / 10) * -10) * '\x03' & 0x1fU));
  uVar1 = (w->field_4).I.SDA;
  uVar2 = puVar5[(ulong)(uVar1 >> 5) + 0xd];
  myGpioDelay((w->field_4).s.bufSize);
  puVar5 = gpioReg;
  uVar3 = (w->field_4).I.SCL;
  uVar4 = uVar3 * 3 + (uVar3 / 10) * -0x1e;
  gpioReg[(ulong)uVar3 / 10] =
       ~(7 << ((byte)uVar4 & 0x1f)) & gpioReg[(ulong)uVar3 / 10] | 1 << (uVar4 & 0x1f);
  uVar3 = (w->field_4).I.SCL;
  puVar5[(ulong)(uVar3 >> 5) + 10] = 1 << ((byte)uVar3 & 0x1f);
  return (int)((uVar2 >> (uVar1 & 0x1f) & 1) != 0);
}

Assistant:

static int I2CGetBit(wfRx_t *w)
{
   int bit;

   set_SDA(w); /* let SDA float */
   I2C_delay(w);
   I2C_clock_stretch(w);
   bit = read_SDA(w);
   I2C_delay(w);
   clear_SCL(w);

   return bit;
}